

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_TimedText.cpp
# Opt level: O3

h__Writer * __thiscall
AS_02::TimedText::MXFWriter::h__Writer::TimedText_TDesc_to_MD
          (h__Writer *this,TimedTextDescriptor *TDesc)

{
  pointer pcVar1;
  undefined8 uVar2;
  undefined8 *in_RDX;
  
  pcVar1 = TDesc[5].NamespaceName._M_dataplus._M_p;
  if (pcVar1 != (pointer)0x0) {
    *(undefined8 *)(pcVar1 + 0xf0) = *in_RDX;
    *(ulong *)(pcVar1 + 0xf8) = (ulong)*(uint *)(in_RDX + 1);
    pcVar1[0x100] = '\x01';
    pcVar1[0x178] = '\x01';
    uVar2 = *(undefined8 *)((long)in_RDX + 0x14);
    *(undefined8 *)(pcVar1 + 0x179) = *(undefined8 *)((long)in_RDX + 0xc);
    *(undefined8 *)(pcVar1 + 0x181) = uVar2;
    ASDCP::MXF::UTF16String::operator=((UTF16String *)(pcVar1 + 0x1b8),(string *)(in_RDX + 4));
    ASDCP::MXF::UTF16String::operator=((UTF16String *)(pcVar1 + 400),(string *)(in_RDX + 8));
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    return this;
  }
  __assert_fail("m_EssenceDescriptor",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_TimedText.cpp"
                ,0x1a4,
                "ASDCP::Result_t AS_02::TimedText::MXFWriter::h__Writer::TimedText_TDesc_to_MD(TimedText::TimedTextDescriptor &)"
               );
}

Assistant:

ASDCP::Result_t
AS_02::TimedText::MXFWriter::h__Writer::TimedText_TDesc_to_MD(TimedText::TimedTextDescriptor& TDesc)
{
  assert(m_EssenceDescriptor);
  ASDCP::MXF::TimedTextDescriptor* TDescObj = (ASDCP::MXF::TimedTextDescriptor*)m_EssenceDescriptor;

  TDescObj->SampleRate = TDesc.EditRate;
  TDescObj->ContainerDuration = TDesc.ContainerDuration;
  TDescObj->ResourceID.Set(TDesc.AssetID);
  TDescObj->NamespaceURI = TDesc.NamespaceName;
  TDescObj->UCSEncoding = TDesc.EncodingName;

  return RESULT_OK;
}